

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

bool DynamicProfileStorage::Initialize(void)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 *pcVar4;
  bool local_21;
  uint local_20;
  bool local_19;
  uint32 i;
  bool readSuccessful;
  uint32 MAX_TRIES;
  uint32 DELAY_INTERVAL;
  uint32 MAX_DELAY;
  bool success;
  
  if (initialized) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,299,"(!initialized)","Initialize called multiple times");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((initialized & 1U) == 0) {
    DELAY_INTERVAL._3_1_ = true;
    initialized = true;
    bVar2 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,DynamicProfileCacheDirFlag);
    if (bVar2) {
      enabled = true;
      collectInfo = true;
      pcVar4 = Js::String::operator_cast_to_char16_t_((String *)&DAT_01ea4110);
      DELAY_INTERVAL._3_1_ = SetupCacheDir(pcVar4);
    }
    bVar2 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,DynamicProfileInputFlag);
    if (bVar2) {
      enabled = true;
      ClearCacheCatalog();
      pcVar4 = Js::String::operator_cast_to_char16_t_((String *)&DAT_01ea4118);
      if (pcVar4 == (char16 *)0x0) {
        collectInfo = true;
      }
      else {
        local_21 = true;
        if ((collectInfo & 1U) == 0) {
          local_21 = Js::ConfigFlagsTable::IsEnabled
                               ((ConfigFlagsTable *)&Js::Configuration::Global,
                                DynamicProfileCacheFlag);
        }
        collectInfo = local_21;
        local_19 = false;
        for (local_20 = 0; local_20 < 0x14; local_20 = local_20 + 1) {
          pcVar4 = Js::String::operator_cast_to_char16_t_((String *)&DAT_01ea4118);
          local_19 = ImportFile(pcVar4,false);
          if (local_19) break;
          Sleep(100);
          if ((DAT_01ec73ca & 1) != 0) {
            pcVar4 = Js::String::operator_cast_to_char16_t_((String *)&DAT_01ea4118);
            Output::Print(L"  Retrying load of dynamic profile from \'%s\' (attempt %d)...\n",pcVar4
                          ,(ulong)(local_20 + 1));
            Output::Flush();
          }
        }
        if (local_19 == false) {
          collectInfo = true;
        }
      }
    }
    else {
      bVar2 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,DynamicProfileCacheFlag);
      if (bVar2) {
        enabled = true;
        collectInfo = true;
        pcVar4 = Js::String::operator_cast_to_char16_t_((String *)&DAT_01ea4100);
        if (pcVar4 != (char16 *)0x0) {
          pcVar4 = Js::String::operator_cast_to_char16_t_((String *)&DAT_01ea4100);
          bVar2 = ImportFile(pcVar4,true);
          if (!bVar2) {
            DELAY_INTERVAL._3_1_ = false;
          }
        }
      }
    }
  }
  else {
    DELAY_INTERVAL._3_1_ = true;
  }
  return DELAY_INTERVAL._3_1_;
}

Assistant:

bool DynamicProfileStorage::Initialize()
{
    AssertOrFailFastMsg(!initialized, "Initialize called multiple times");
    if (initialized)
    {
        return true;
    }

    bool success = true;
    initialized = true;

#ifdef FORCE_DYNAMIC_PROFILE_STORAGE
    enabled = true;
    collectInfo = true;
    if (!SetupCacheDir(nullptr))
    {
        success = false;
    }

#else
    if (Js::Configuration::Global.flags.IsEnabled(Js::DynamicProfileCacheDirFlag))
    {
        enabled = true;
        collectInfo = true;
        if (!SetupCacheDir(Js::Configuration::Global.flags.DynamicProfileCacheDir))
        {
            success = false;
        }
    }
#endif

    // If -DynamicProfileInput is specified, the file specified in -DynamicProfileCache
    // will not be imported and will be overwritten
    if (Js::Configuration::Global.flags.IsEnabled(Js::DynamicProfileInputFlag))
    {
        enabled = true;
        ClearCacheCatalog();

        // -DynamicProfileInput
        //      Without other -DynamicProfile flags - enable in memory profile cache without exporting
        //      With -DynamicProfileCache           - override the dynamic profile cache file
        //      With -DynamicProfileCacheDir        - clear the dynamic profile cache directory

        if (Js::Configuration::Global.flags.DynamicProfileInput != nullptr)
        {
            // Error if we can't in the profile info if we are not using a cache file or directory.
            collectInfo = collectInfo || Js::Configuration::Global.flags.IsEnabled(Js::DynamicProfileCacheFlag);

            // Try to open the DynamicProfileInput.
            // If failure to open, retry at 100 ms intervals until a timeout.

            const uint32 MAX_DELAY = 2000;  // delay at most 2 seconds
            const uint32 DELAY_INTERVAL = 100;
            const uint32 MAX_TRIES = MAX_DELAY / DELAY_INTERVAL;
            bool readSuccessful = false;

            for (uint32 i = 0; i < MAX_TRIES; i++)
            {
                readSuccessful = ImportFile(Js::Configuration::Global.flags.DynamicProfileInput, false);
                if (readSuccessful)
                {
                    break;
                }

                Sleep(DELAY_INTERVAL);
                if (Js::Configuration::Global.flags.Verbose)
                {
                    Output::Print(_u("  Retrying load of dynamic profile from '%s' (attempt %d)...\n"),
                        (char16 const *)Js::Configuration::Global.flags.DynamicProfileInput, i + 1);
                    Output::Flush();
                }
            }

            if (!readSuccessful)
            {
                // If file cannot be read, behave as if DynamicProfileInput == null.
                collectInfo = true;
            }
        }
        else
        {
            // Don't error if we can't find the profile info
            collectInfo = true;
        }
    }
    else if (Js::Configuration::Global.flags.IsEnabled(Js::DynamicProfileCacheFlag))
    {
        enabled = true;
        collectInfo = true;
        if (Js::Configuration::Global.flags.DynamicProfileCache)
        {
            if (!ImportFile(Js::Configuration::Global.flags.DynamicProfileCache, true))
            {
                success = false;
            }
        }
    }

    return success;
}